

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-arch.h
# Opt level: O1

bool operator==(string *str,LLM_TN_IMPL *tn)

{
  size_t __n;
  int iVar1;
  bool bVar2;
  string local_30;
  
  LLM_TN_IMPL::str_abi_cxx11_(&local_30,tn);
  __n = str->_M_string_length;
  if (__n == local_30._M_string_length) {
    if (__n == 0) {
      bVar2 = true;
    }
    else {
      iVar1 = bcmp((str->_M_dataplus)._M_p,local_30._M_dataplus._M_p,__n);
      bVar2 = iVar1 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool operator==(const std::string & str, const LLM_TN_IMPL & tn) {
        return str == tn.str();
    }